

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.h
# Opt level: O3

void __thiscall
TableBaseExpression::GenerateElementCode
          (TableBaseExpression *this,ExpressionPtr *key,ExpressionPtr *value,char eolChar,
          ostream *out,int n)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  ArrayIndexingExpression *this_00;
  string name;
  shared_ptr<ConstantExpression> labelExp;
  shared_ptr<ConstantExpression> labelExp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  string local_a0;
  undefined1 local_80 [16];
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  Expression local_40;
  _Alloc_hider local_38;
  
  iVar6 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_Expression)();
  if ((iVar6 != 7) &&
     (iVar6 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                 _vptr_Expression)(), iVar6 != 0xb)) goto LAB_00115615;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_58._8_8_ = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_48 = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_48->_M_use_count = local_48->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_48->_M_use_count = local_48->_M_use_count + 1;
    }
  }
  ConstantExpression::AsLabelExpression
            ((ConstantExpression *)&local_40,(ExpressionPtr *)(local_58 + 8));
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if ((ConstantExpression *)local_40._vptr_Expression == (ConstantExpression *)0x0) {
    iVar6 = (**((key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _vptr_Expression)();
    if (iVar6 == 5) {
      this_00 = (ArrayIndexingExpression *)
                (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var2 = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if ((this_00->super_OperatorExpression).m_operator == -0xfffff9) {
LAB_00115498:
          bVar3 = true;
          local_a8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_001154b1;
        }
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        iVar6 = (this_00->super_OperatorExpression).m_operator;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        if (iVar6 == -0xfffff9) {
          this_00 = (ArrayIndexingExpression *)
                    (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_a8 = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
                     _M_pi;
          if (local_a8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00115498;
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_a8->_M_use_count = local_a8->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_a8->_M_use_count = local_a8->_M_use_count + 1;
          }
          bVar3 = false;
LAB_001154b1:
          bVar5 = ArrayIndexingExpression::IsSimpleMemberDeref(this_00);
          if (bVar5) {
            iVar6 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->_vptr_Expression)();
            if (iVar6 == 7) {
              ArrayIndexingExpression::ToFunctionNameString_abi_cxx11_((string *)local_80,this_00);
            }
            else {
              ArrayIndexingExpression::ToString_abi_cxx11_((string *)local_80,this_00);
            }
            std::__cxx11::string::operator=((string *)&local_a0,(string *)local_80);
            if ((ConstantExpression *)local_80._0_8_ != (ConstantExpression *)local_70) {
              operator_delete((void *)local_80._0_8_,local_70._0_8_ + 1);
            }
          }
          if (!bVar3) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
          }
        }
      }
    }
  }
  else {
    ConstantExpression::GetLabel_abi_cxx11_
              ((string *)local_80,(ConstantExpression *)local_40._vptr_Expression);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)local_80);
    if ((ConstantExpression *)local_80._0_8_ != (ConstantExpression *)local_70) {
      operator_delete((void *)local_80._0_8_,local_70._0_8_ + 1);
    }
  }
  sVar4 = local_a0._M_string_length;
  if (local_a0._M_string_length != 0) {
    iVar6 = (**((value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _vptr_Expression)();
    peVar1 = (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (iVar6 == 7) {
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      std::__cxx11::string::_M_assign((string *)(peVar1 + 1));
    }
    else {
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      std::__cxx11::string::_M_assign((string *)(peVar1 + 1));
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    peVar1 = (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if (sVar4 != 0) {
    return;
  }
LAB_00115615:
  local_70._16_8_ = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._0_8_ =
       (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_)->_M_use_count + 1;
    }
  }
  ConstantExpression::AsLabelExpression
            ((ConstantExpression *)local_80,(ExpressionPtr *)(local_70 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._0_8_);
  }
  if ((ConstantExpression *)local_80._0_8_ == (ConstantExpression *)0x0) {
    local_a0._M_dataplus._M_p._0_1_ = 0x5b;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_a0,1);
    peVar1 = (key->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
    local_a0._M_dataplus._M_p._0_1_ = 0x5d;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_a0,1);
  }
  else {
    ConstantExpression::GetLabel_abi_cxx11_(&local_a0,(ConstantExpression *)local_80._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                               local_a0.field_2._M_local_buf[0]) + 1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(out," = ",3);
  peVar1 = (value->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Expression[1])(peVar1,out,(ulong)(uint)n);
  if (eolChar != '\0') {
    local_a0._M_dataplus._M_p._0_1_ = eolChar;
    std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_a0,1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80._8_8_);
  }
  return;
}

Assistant:

inline void TableBaseExpression::GenerateElementCode( ExpressionPtr key, ExpressionPtr value, char eolChar, std::ostream& out, int n ) const
{
	if (value->GetType() == Exp_Function || value->GetType() == Exp_NewClassExpression)
	{
		// Member function or nested class - find its name
		std::string name;
			
		shared_ptr<ConstantExpression> labelExp = ConstantExpression::AsLabelExpression(key);
		if (labelExp)
		{
			name = labelExp->GetLabel();
		}
		else if (key->GetType() == Exp_Operator && static_pointer_cast<OperatorExpression>(key)->GetOperatorType() == OperatorExpression::OPER_ARRAYIND)
		{
			shared_ptr<ArrayIndexingExpression> derefExp = static_pointer_cast<ArrayIndexingExpression>(key);
			if (derefExp->IsSimpleMemberDeref())
			{
				if (value->GetType() == Exp_Function)
					name = derefExp->ToFunctionNameString();
				else
					name = derefExp->ToString();
			}
		}

		if (!name.empty())
		{
			if (value->GetType() == Exp_Function)
			{
				shared_ptr<FunctionExpression> func = static_pointer_cast<FunctionExpression>(value);
				func->SetName(name);
			}
			else
			{
				shared_ptr<NewClassExpression> newClass = static_pointer_cast<NewClassExpression>(value);
				newClass->SetName(name);
			}

			value->GenerateCode(out, n);
			out << std::endl;
			return;
		}
	}

	shared_ptr<ConstantExpression> labelExp = ConstantExpression::AsLabelExpression(key);
	if (labelExp)
	{
		out << labelExp->GetLabel();
	}
	else
	{
		out << '[';
		key->GenerateCode(out, n);
		out << ']';
	}

	out << " = ";
	value->GenerateCode(out, n);

	if (eolChar != 0)
		out << eolChar;
}